

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointFrame.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLinkPointFrameGeneric::IntStateScatterReactions
          (ChLinkPointFrameGeneric *this,uint off_L,ChVectorDynamic<> *L)

{
  int iVar1;
  
  iVar1 = 0;
  if ((this->c_x == true) &&
     (iVar1 = 0, (this->constraint1).super_ChConstraintTwo.super_ChConstraint.active == true)) {
    if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
        (long)(ulong)off_L) goto LAB_0062bb93;
    (this->m_react).m_data[0] =
         (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data[off_L]
    ;
    iVar1 = 1;
  }
  if ((this->c_y == true) &&
     ((this->constraint2).super_ChConstraintTwo.super_ChConstraint.active == true)) {
    if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
        (long)(ulong)(iVar1 + off_L)) goto LAB_0062bb93;
    (this->m_react).m_data[1] =
         (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
         [iVar1 + off_L];
    iVar1 = iVar1 + 1;
  }
  if ((this->c_z == true) &&
     ((this->constraint3).super_ChConstraintTwo.super_ChConstraint.active == true)) {
    if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
        (long)(ulong)(iVar1 + off_L)) {
LAB_0062bb93:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                   );
    }
    (this->m_react).m_data[2] =
         (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
         [iVar1 + off_L];
  }
  return;
}

Assistant:

void ChLinkPointFrameGeneric::IntStateScatterReactions(const unsigned int off_L, const ChVectorDynamic<>& L) {
    int nc = 0;
    if (c_x && this->constraint1.IsActive()) {
        m_react.x() = L(off_L + nc);
        nc++;
    }
    if (c_y && this->constraint2.IsActive()) {
        m_react.y() = L(off_L + nc);
        nc++;
    }
    if (c_z && this->constraint3.IsActive()) {
        m_react.z() = L(off_L + nc);
        // nc++;
    }
}